

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionEvaluation.hpp
# Opt level: O2

Option<Kernel::PolyNf> * __thiscall
Inferences::simplFloor<Kernel::NumTraits<Kernel::RealConstantType>>
          (Option<Kernel::PolyNf> *__return_storage_ptr__,Inferences *this,PolyNf *evalArgs)

{
  Self SVar1;
  uint uVar2;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar3;
  bool bVar4;
  long lVar5;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar6;
  RationalConstantType *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  FuncId FVar7;
  FuncId f;
  int local_484;
  OptionBase<Kernel::PolyNf> *local_480;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  pulledOut;
  Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  keptIn;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> monom;
  undefined1 local_428 [16];
  PolyNf floorTerm;
  undefined1 local_3f8 [16];
  int local_3e8;
  mp_limb_t *local_3e0;
  Lib local_3d8 [16];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_3c8;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_3b8;
  Numeral k;
  StlIter __begin0;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_378;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_358;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_338;
  RationalConstantType local_328;
  Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> local_308;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_2f8;
  RationalConstantType local_2d8;
  RationalConstantType local_2b8;
  RationalConstantType local_298;
  RationalConstantType local_278;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  poly;
  RationalConstantType local_238;
  Option<Kernel::RealConstantType> inner;
  RationalConstantType local_1f0;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_1d0;
  FuncTerm local_1a0;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_170;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_140;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_128;
  RationalConstantType local_f8;
  Numeral i;
  AnyPoly local_b8;
  AnyPoly local_a4;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_90;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_60;
  
  local_480 = &__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>;
  Lib::
  Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  ::
  match<Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::Variable)_1_,Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>()const::_lambda(Kernel::AnyPoly)_1_>
            (&inner);
  if (inner.super_OptionBase<Kernel::RealConstantType>._isSome == true) {
    Kernel::RationalConstantType::floor
              ((RationalConstantType *)local_3f8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)
              );
    Kernel::RealConstantType::RealConstantType
              ((RealConstantType *)&local_238,(IntegerConstantType *)local_3f8);
    Kernel::PolyNf::fromNumeral<Kernel::RealConstantType>
              ((PolyNf *)&monom,(RealConstantType *)&local_238);
    Lib::OptionBase<Kernel::PolyNf>::OptionBase(local_480,(PolyNf *)&monom);
    Kernel::RationalConstantType::~RationalConstantType(&local_238);
    Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)local_3f8);
  }
  else {
    Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RealConstantType>>((PolyNf *)&poly);
    Lib::
    Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled(&pulledOut);
    Lib::
    Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled(&keptIn);
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[7] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[8] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[9] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[10] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xb] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xc] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xd] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xe] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0xf] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0x10] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0x11] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0x12] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0x13] = '\0';
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._21_3_ = 0;
    floorTerm.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._0_8_ = poly._ptr;
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::StlIter::StlIter(&__begin0,
                       (IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
                        *)&floorTerm);
    while (pMVar6 = &monom,
          (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>)
          __begin0._cur.
          super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>.
          super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>.
          _elem != (OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>
                    )0x0) {
      Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                (pMVar6,(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                        __begin0._cur.
                        super_OptionBase<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>
                        .
                        super_OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_*>
                        ._elem);
      Kernel::RationalConstantType::RationalConstantType
                (&k.super_RationalConstantType,(RationalConstantType *)pMVar6);
      pMVar3 = monom.factors._ptr;
      uVar2 = monom.factors._id;
      bVar4 = isInteger<Kernel::NumTraits<Kernel::RealConstantType>>
                        ((Inferences *)monom.factors._ptr,
                         (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)pMVar6);
      SVar1 = keptIn._self;
      if (bVar4) {
        Kernel::RationalConstantType::floor
                  ((RationalConstantType *)&stack0xfffffffffffffda8,
                   (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        Kernel::RealConstantType::RealConstantType
                  ((RealConstantType *)&i,(IntegerConstantType *)&stack0xfffffffffffffda8);
        Kernel::IntegerConstantType::~IntegerConstantType
                  ((IntegerConstantType *)&stack0xfffffffffffffda8);
        Kernel::RationalConstantType::RationalConstantType(&local_f8,(RationalConstantType *)&i);
        local_484 = 0;
        bVar4 = Kernel::operator!=((RealConstantType *)&local_f8,&local_484);
        Kernel::RationalConstantType::~RationalConstantType(&local_f8);
        SVar1 = pulledOut._self;
        if (bVar4) {
          Kernel::RationalConstantType::RationalConstantType(&local_278,(RationalConstantType *)&i);
          local_3b8._id = uVar2;
          local_3b8._ptr = pMVar3;
          Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                    (&local_60,(Numeral *)&local_278,&local_3b8);
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                    ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     SVar1._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl,&local_60);
          Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&local_60);
          Kernel::RationalConstantType::~RationalConstantType(&local_278);
        }
        Kernel::RealConstantType::operator-
                  ((RealConstantType *)&local_1f0,&k,(RealConstantType *)&i);
        local_484 = 0;
        bVar4 = Kernel::operator!=((RealConstantType *)&local_1f0,&local_484);
        Kernel::RationalConstantType::~RationalConstantType(&local_1f0);
        SVar1 = keptIn._self;
        pMVar6 = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&i;
        if (bVar4) {
          Kernel::RealConstantType::operator-
                    ((RealConstantType *)&local_298,&k,(RealConstantType *)&i);
          local_3c8._id = uVar2;
          local_3c8._ptr = pMVar3;
          Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                    (&local_90,(Numeral *)&local_298,&local_3c8);
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                    ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     SVar1._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl,&local_90);
          Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&local_90);
          Kernel::RationalConstantType::~RationalConstantType(&local_298);
        }
      }
      else {
        Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom(&local_128,&monom);
        Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                  ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                   SVar1._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                   ._M_head_impl,&local_128);
        pMVar6 = &local_128;
      }
      Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)pMVar6);
      Kernel::RationalConstantType::~RationalConstantType(&k.super_RationalConstantType);
      Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&monom);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
      ::StlIter::operator++(&__begin0);
    }
    if (*(long *)((long)pulledOut._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                        ._M_head_impl + 0x10) ==
        *(long *)((long)pulledOut._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                        ._M_head_impl + 8)) {
      *(undefined8 *)((long)&(local_480->_elem)._elem + 8) = 0;
      *(undefined8 *)((long)&(local_480->_elem)._elem + 0x10) = 0;
      *(undefined8 *)local_480 = 0;
      *(undefined8 *)((long)&(local_480->_elem)._elem + 4) = 0;
    }
    else {
      lVar5 = (*(long *)((long)keptIn._self._M_t.
                               super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                               .
                               super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                               ._M_head_impl + 0x10) -
              (long)*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                     ((long)keptIn._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                            ._M_head_impl + 8)) / 0x30;
      if (lVar5 != 0) {
        if ((lVar5 == 1) &&
           (bVar4 = Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::isNumeral
                              (*(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                                ((long)keptIn._self._M_t.
                                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                                       .
                                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                                       ._M_head_impl + 8)), bVar4)) {
          Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::tryNumeral
                    ((Option<Kernel::RealConstantType> *)&monom,
                     *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)
                      ((long)keptIn._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                             ._M_head_impl + 8));
          Kernel::RationalConstantType::floor
                    ((RationalConstantType *)local_428,
                     (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
          Kernel::RealConstantType::RealConstantType
                    ((RealConstantType *)&floorTerm,(IntegerConstantType *)local_428);
          Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)local_428);
          Lib::OptionBase<Kernel::RealConstantType>::~OptionBase
                    ((OptionBase<Kernel::RealConstantType> *)&monom);
          Kernel::RationalConstantType::RationalConstantType
                    (&local_2b8,(RationalConstantType *)&floorTerm);
          monom.numeral.super_RationalConstantType._num._val[0]._mp_alloc = 0;
          bVar4 = Kernel::operator!=((RealConstantType *)&local_2b8,(int *)&monom);
          Kernel::RationalConstantType::~RationalConstantType(&local_2b8);
          SVar1 = pulledOut._self;
          if (bVar4) {
            Kernel::RationalConstantType::RationalConstantType
                      (&local_2d8,(RationalConstantType *)&floorTerm);
            Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                      (&local_170,(Numeral *)&local_2d8);
            Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                      ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                       SVar1._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                       ._M_head_impl,&local_170);
            Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&local_170);
            Kernel::RationalConstantType::~RationalConstantType(&local_2d8);
          }
          this_00 = (RationalConstantType *)&floorTerm;
        }
        else {
          Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
                    ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_2f8,
                     (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     keptIn._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl);
          Lib::
          perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                    (local_3d8,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_2f8);
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[4] = '\0';
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[5] = '\0';
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[6] = '\0';
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[7] = '\0';
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._17_3_ = 0;
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._0_1_ = 2;
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[0] = (char)local_3d8[0];
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[1] = (char)local_3d8[1];
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[2] = (char)local_3d8[2];
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[3] = (char)local_3d8[3];
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content._8_3_ = SUB83(local_3d8._8_8_,0);
          local_a4.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content._11_5_ = SUB85(local_3d8._8_8_,3);
          Kernel::PolyNf::PolyNf((PolyNf *)&monom,&local_a4);
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
                    (&local_2f8);
          FVar7 = Kernel::FuncId::fromInterpretation(REAL_FLOOR);
          f._typeArgs = FVar7._typeArgs;
          f._4_4_ = 0;
          f._num = FVar7._num;
          Kernel::FuncTerm::FuncTerm(&local_1a0,f,(PolyNf *)&monom);
          Lib::perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>((Lib *)&local_308,&local_1a0);
          Kernel::PolyNf::PolyNf(&floorTerm,&local_308);
          Lib::Stack<Kernel::PolyNf>::~Stack(&local_1a0._args);
          SVar1 = pulledOut._self;
          Kernel::RealConstantType::RealConstantType((RealConstantType *)&local_328,1);
          Lib::CoproductImpl::TrivialOperations::CopyCons::
          DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
          ::DefaultImpl(&local_140,
                        (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                         *)&floorTerm);
          Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactors
                    ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_358,
                     (PolyNf *)&local_140);
          Lib::
          perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                    ((Lib *)&local_338,
                     (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_358);
          Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                    (&local_1d0,(Numeral *)&local_328,&local_338);
          Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                    ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                     SVar1._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                     ._M_head_impl,&local_1d0);
          Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)&local_1d0);
          Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
                    (&local_358);
          this_00 = &local_328;
        }
        Kernel::RationalConstantType::~RationalConstantType(this_00);
      }
      std::
      __sort<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
                (*(undefined8 *)
                  ((long)pulledOut._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                         ._M_head_impl + 8),
                 *(undefined8 *)
                  ((long)pulledOut._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                         ._M_head_impl + 0x10));
      Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
                ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_378,
                 (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                 pulledOut._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_std::default_delete<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 .
                 super__Head_base<0UL,_Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_*,_false>
                 ._M_head_impl);
      Lib::
      perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                ((Lib *)&local_3e8,
                 (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_378);
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[4] = '\0';
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[5] = '\0';
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[6] = '\0';
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[7] = '\0';
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._17_3_ = 0;
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._0_1_ = 2;
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[0] = (undefined1)local_3e8;
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[1] = local_3e8._1_1_;
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[2] = local_3e8._2_1_;
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content[3] = local_3e8._3_1_;
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content._8_3_ = SUB83(local_3e0,0);
      local_b8.super_AnyPolySuper._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ._content._11_5_ = SUB85((ulong)local_3e0 >> 0x18,0);
      Kernel::PolyNf::PolyNf((PolyNf *)&monom,&local_b8);
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_378);
      Lib::OptionBase<Kernel::PolyNf>::OptionBase(local_480,(PolyNf *)&monom);
    }
    Lib::
    Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&keptIn);
    Lib::
    Recycled<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&pulledOut);
  }
  Lib::OptionBase<Kernel::RealConstantType>::~OptionBase
            (&inner.super_OptionBase<Kernel::RealConstantType>);
  return (Option<Kernel::PolyNf> *)local_480;
}

Assistant:

inline Option<PolyNf> simplFloor(PolyNf* evalArgs)
{
  using Numeral = typename NumTraits::ConstantType;
  auto inner = evalArgs[0].tryNumeral<NumTraits>();
  if (inner) {
    return some(PolyNf::fromNumeral(Numeral(inner->floor())));
  }  else {
    auto poly = evalArgs[0].wrapPoly<NumTraits>();
    // floor(s1 + ... + sn + t1 + ... + tm) ===> s1 + ... + sn + floor(t1 + ... + tn)
    //                              pulledOut <--^^^^^^^^^^^^^         ^^^^^^^^^^^^^--> keptIn
    Recycled<Stack<Monom<NumTraits>>> pulledOut;
    Recycled<Stack<Monom<NumTraits>>> keptIn;
    for (auto monom : poly->iterSummands()) {
      auto k = monom.numeral;
      auto t = monom.factors;
      if (isInteger(*t)) {
        // floor(t + k t) ==> floor(t + (k - i) t) + i t
        //   where t is an integer and
        //         i = floor(k)
        auto i = Numeral(k.floor());
        if (i       != 0) { pulledOut->push(Monom(i   , t)); }
        if ((k - i) != 0) { keptIn->   push(Monom(k -i, t)); }
      } else {
        keptIn->push(monom);
      }
    }

    if (pulledOut->size() == 0) {
      return {};

    } else {


      if (keptIn->size() == 0) {

      } else if (keptIn->size() == 1 && (*keptIn)[0].isNumeral()) { 
        auto numFloor = Numeral((*keptIn)[0].tryNumeral()->floor());
        if (numFloor != 0)
          pulledOut->push(Monom<NumTraits>(numFloor));
      } else {
        auto innerSum = PolyNf(AnyPoly(perfect(Polynom<NumTraits>(std::move(*keptIn)))));
        auto floorTerm = PolyNf(perfect(FuncTerm(FuncId::fromInterpretation(NumTraits::floorI), &innerSum)));
        pulledOut->push(Monom<NumTraits>(Numeral(1), perfect(MonomFactors<NumTraits>(floorTerm))));
      }


      std::sort(pulledOut->begin(), pulledOut->end());

      auto out = PolyNf(AnyPoly(perfect(Polynom<NumTraits>(std::move(*pulledOut)))));
      return some(out);
    }
  }
}